

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsrfs.c
# Opt level: O0

void zgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,double *R,double *C,SuperMatrix *B,SuperMatrix *X,double *ferr,double *berr,
           SuperLUStat_t *stat,int *info)

{
  integer *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  doublecomplex beta;
  doublecomplex alpha;
  int iVar6;
  doublecomplex *zy;
  void *addr;
  int *addr_00;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_3f8;
  double local_3e0;
  double local_3c0;
  double local_3a8;
  double local_398;
  int local_378;
  int local_370;
  char local_368 [8];
  char msg_1 [256];
  char msg [256];
  int isave [3];
  int *iwork;
  double *rwork;
  doublecomplex *work;
  trans_t transt;
  char transc [1];
  double safmin;
  double eps;
  double lstres;
  double xk;
  double s;
  int nrhs;
  int ldx;
  int ldb;
  int colequ;
  int rowequ;
  int notran;
  int count;
  int nz;
  int irow;
  int k;
  int j;
  int i;
  double safe2;
  double safe1;
  doublecomplex *pdStack_c8;
  int kase;
  doublecomplex *Xptr;
  doublecomplex *Bptr;
  doublecomplex *Xmat;
  doublecomplex *Bmat;
  DNformat *Bjcol_store;
  DNformat *Xstore;
  DNformat *Bstore;
  SuperMatrix Bjcol;
  doublecomplex *Aval;
  NCformat *Astore;
  doublecomplex done;
  doublecomplex ndone;
  int nrow;
  int ione;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  SuperMatrix *A_local;
  trans_t trans_local;
  
  ndone.i._4_4_ = 1;
  ndone.i._0_4_ = A->nrow;
  done.i = -1.0;
  ndone.r = 0.0;
  Astore = (NCformat *)0x3ff0000000000000;
  done.r = 0.0;
  pvVar5 = A->Store;
  Bjcol.Store = *(void **)((long)pvVar5 + 8);
  Xstore = (DNformat *)B->Store;
  Bjcol_store = (DNformat *)X->Store;
  Xmat = (doublecomplex *)Xstore->nzval;
  Bptr = (doublecomplex *)Bjcol_store->nzval;
  iVar2 = Xstore->lda;
  iVar3 = Bjcol_store->lda;
  iVar4 = B->ncol;
  *info = 0;
  bVar8 = trans == NOTRANS;
  if (((bVar8) || (trans == TRANS)) || (trans == CONJ)) {
    if (((A->nrow == A->ncol) && (-1 < A->nrow)) &&
       ((A->Stype == SLU_NC && ((A->Dtype == SLU_Z && (A->Mtype == SLU_GE)))))) {
      if ((((L->nrow == L->ncol) && (-1 < L->nrow)) && (L->Stype == SLU_SC)) &&
         ((L->Dtype == SLU_Z && (L->Mtype == SLU_TRLU)))) {
        if (((U->nrow == U->ncol) && (-1 < U->nrow)) &&
           ((U->Stype == SLU_NC && ((U->Dtype == SLU_Z && (U->Mtype == SLU_TRU)))))) {
          if (A->nrow < 0) {
            local_370 = 0;
          }
          else {
            local_370 = A->nrow;
          }
          if ((((iVar2 < local_370) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_Z)) ||
             (B->Mtype != SLU_GE)) {
            *info = -10;
          }
          else {
            if (A->nrow < 0) {
              local_378 = 0;
            }
            else {
              local_378 = A->nrow;
            }
            if (((iVar3 < local_378) || (X->Stype != SLU_DN)) ||
               ((X->Dtype != SLU_Z || (X->Mtype != SLU_GE)))) {
              *info = -0xb;
            }
          }
        }
        else {
          *info = -4;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    if ((A->nrow == 0) || (iVar4 == 0)) {
      for (irow = 0; irow < iVar4; irow = irow + 1) {
        ferr[irow] = 0.0;
        berr[irow] = 0.0;
      }
    }
    else {
      iVar6 = strncmp(equed,"R",1);
      bVar9 = true;
      if (iVar6 != 0) {
        iVar6 = strncmp(equed,"B",1);
        bVar9 = iVar6 == 0;
      }
      iVar6 = strncmp(equed,"C",1);
      bVar10 = true;
      if (iVar6 != 0) {
        iVar6 = strncmp(equed,"B",1);
        bVar10 = iVar6 == 0;
      }
      zy = doublecomplexMalloc((long)(A->nrow << 1));
      addr = superlu_malloc((long)A->nrow << 3);
      addr_00 = int32Malloc(A->nrow);
      if (((zy == (doublecomplex *)0x0) || (addr == (void *)0x0)) || (addr_00 == (int *)0x0)) {
        sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c")
        ;
        superlu_abort_and_exit(msg_1 + 0xf8);
      }
      if (bVar8) {
        work._7_1_ = 0x4e;
        work._0_4_ = TRANS;
      }
      else if (trans == TRANS) {
        work._7_1_ = 0x54;
        work._0_4_ = NOTRANS;
      }
      else if (trans == CONJ) {
        work._7_1_ = 0x43;
        work._0_4_ = NOTRANS;
      }
      iVar6 = A->ncol;
      dVar11 = dmach("Epsilon");
      _transt = dmach("Safe minimum");
      safe2 = (double)(iVar6 + 1) * _transt;
      _j = safe2 / dVar11;
      for (k = 0; k < A->nrow; k = k + 1) {
        addr_00[k] = 0;
      }
      if (bVar8) {
        for (nz = 0; nz < A->ncol; nz = nz + 1) {
          for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
              k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
            iVar6 = *(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
            addr_00[iVar6] = addr_00[iVar6] + 1;
          }
        }
      }
      else {
        for (nz = 0; nz < A->ncol; nz = nz + 1) {
          addr_00[nz] = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4) -
                        *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
        }
      }
      Bstore._0_4_ = B->Stype;
      Bstore._4_4_ = B->Dtype;
      Bjcol.Stype = B->Mtype;
      Bjcol.Dtype = B->nrow;
      Bjcol.Mtype = SLU_TRLU;
      Bjcol._16_8_ = superlu_malloc(0x10);
      if ((void *)Bjcol._16_8_ == (void *)0x0) {
        sprintf(local_368,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c")
        ;
        superlu_abort_and_exit(local_368);
      }
      Bmat = (doublecomplex *)Bjcol._16_8_;
      *(int *)Bjcol._16_8_ = iVar2;
      *(doublecomplex **)(Bjcol._16_8_ + 8) = zy;
      for (irow = 0; irow < iVar4; irow = irow + 1) {
        rowequ = 0;
        eps = 3.0;
        Xptr = Xmat + irow * iVar2;
        pdStack_c8 = Bptr + irow * iVar3;
        while( true ) {
          piVar1 = (integer *)((long)&ndone.i + 4);
          zcopy_((integer *)&ndone.i,Xptr,piVar1,zy,piVar1);
          alpha.i = ndone.r;
          alpha.r = done.i;
          beta.i = done.r;
          beta.r = (double)Astore;
          sp_zgemv((char *)((long)&work + 7),alpha,A,pdStack_c8,ndone.i._4_4_,beta,zy,ndone.i._4_4_)
          ;
          for (k = 0; k < A->nrow; k = k + 1) {
            dVar12 = z_abs1(Xptr + k);
            *(double *)((long)addr + (long)k * 8) = dVar12;
          }
          if (bVar8) {
            for (nz = 0; nz < A->ncol; nz = nz + 1) {
              dVar12 = z_abs1(pdStack_c8 + nz);
              for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                  k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
                dVar13 = z_abs1((doublecomplex *)((long)Bjcol.Store + (long)k * 0x10));
                lVar7 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
                *(double *)((long)addr + lVar7 * 8) =
                     dVar13 * dVar12 + *(double *)((long)addr + lVar7 * 8);
              }
            }
          }
          else {
            for (nz = 0; nz < A->ncol; nz = nz + 1) {
              xk = 0.0;
              for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                  k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
                iVar6 = *(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
                dVar12 = z_abs1((doublecomplex *)((long)Bjcol.Store + (long)k * 0x10));
                dVar13 = z_abs1(pdStack_c8 + iVar6);
                xk = dVar12 * dVar13 + xk;
              }
              *(double *)((long)addr + (long)nz * 8) = xk + *(double *)((long)addr + (long)nz * 8);
            }
          }
          xk = 0.0;
          for (k = 0; k < A->nrow; k = k + 1) {
            if (*(double *)((long)addr + (long)k * 8) <= _j) {
              dVar12 = *(double *)((long)addr + (long)k * 8);
              if ((dVar12 != 0.0) || (NAN(dVar12))) {
                dVar12 = z_abs1(zy + k);
                if (xk <= (dVar12 + safe2) / *(double *)((long)addr + (long)k * 8)) {
                  dVar12 = z_abs1(zy + k);
                  local_3a8 = (dVar12 + safe2) / *(double *)((long)addr + (long)k * 8);
                }
                else {
                  local_3a8 = xk;
                }
                xk = local_3a8;
              }
            }
            else {
              dVar12 = z_abs1(zy + k);
              if (xk <= dVar12 / *(double *)((long)addr + (long)k * 8)) {
                local_398 = z_abs1(zy + k);
                local_398 = local_398 / *(double *)((long)addr + (long)k * 8);
              }
              else {
                local_398 = xk;
              }
              xk = local_398;
            }
          }
          berr[irow] = xk;
          if (((berr[irow] <= dVar11) || (eps < berr[irow] * 2.0)) || (4 < rowequ)) break;
          zgstrs(trans,L,U,perm_c,perm_r,(SuperMatrix *)&Bstore,stat,info);
          piVar1 = (integer *)((long)&ndone.i + 4);
          zaxpy_((integer *)&ndone.i,(doublecomplex *)&Astore,zy,piVar1,Bptr + irow * iVar3,piVar1);
          eps = berr[irow];
          rowequ = rowequ + 1;
        }
        stat->RefineSteps = rowequ;
        for (k = 0; k < A->nrow; k = k + 1) {
          dVar12 = z_abs1(Xptr + k);
          *(double *)((long)addr + (long)k * 8) = dVar12;
        }
        if (bVar8) {
          for (nz = 0; nz < A->ncol; nz = nz + 1) {
            dVar12 = z_abs1(pdStack_c8 + nz);
            for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
              dVar13 = z_abs1((doublecomplex *)((long)Bjcol.Store + (long)k * 0x10));
              lVar7 = (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4);
              *(double *)((long)addr + lVar7 * 8) =
                   dVar13 * dVar12 + *(double *)((long)addr + lVar7 * 8);
            }
          }
        }
        else {
          for (nz = 0; nz < A->ncol; nz = nz + 1) {
            xk = 0.0;
            for (k = *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)nz * 4);
                k < *(int *)(*(long *)((long)pvVar5 + 0x18) + (long)(nz + 1) * 4); k = k + 1) {
              dVar12 = z_abs1(pdStack_c8 + *(int *)(*(long *)((long)pvVar5 + 0x10) + (long)k * 4));
              dVar13 = z_abs1((doublecomplex *)((long)Bjcol.Store + (long)k * 0x10));
              xk = dVar13 * dVar12 + xk;
            }
            *(double *)((long)addr + (long)nz * 8) = xk + *(double *)((long)addr + (long)nz * 8);
          }
        }
        for (k = 0; k < A->nrow; k = k + 1) {
          if (*(double *)((long)addr + (long)k * 8) <= _j) {
            dVar12 = z_abs(zy + k);
            *(double *)((long)addr + (long)k * 8) =
                 (double)(addr_00[k] + 1) * dVar11 * *(double *)((long)addr + (long)k * 8) + dVar12
                 + safe2;
          }
          else {
            dVar12 = z_abs(zy + k);
            *(double *)((long)addr + (long)k * 8) =
                 (double)(addr_00[k] + 1) * dVar11 * *(double *)((long)addr + (long)k * 8) + dVar12;
          }
        }
        safe1._4_4_ = 0;
        do {
          zlacon2_((int *)&ndone.i,zy + A->nrow,zy,ferr + irow,(int *)((long)&safe1 + 4),
                   (int *)(msg + 0xfc));
          if (safe1._4_4_ == 0) break;
          if (safe1._4_4_ == 1) {
            if ((bVar8) && (bVar10)) {
              for (k = 0; k < A->ncol; k = k + 1) {
                zy[k].r = zy[k].r * C[k];
                zy[k].i = zy[k].i * C[k];
              }
            }
            else if ((!bVar8) && (bVar9)) {
              for (k = 0; k < A->nrow; k = k + 1) {
                zy[k].r = zy[k].r * R[k];
                zy[k].i = zy[k].i * R[k];
              }
            }
            zgstrs((trans_t)work,L,U,perm_c,perm_r,(SuperMatrix *)&Bstore,stat,info);
            for (k = 0; k < A->nrow; k = k + 1) {
              zy[k].r = zy[k].r * *(double *)((long)addr + (long)k * 8);
              zy[k].i = zy[k].i * *(double *)((long)addr + (long)k * 8);
            }
          }
          else {
            for (k = 0; k < A->nrow; k = k + 1) {
              zy[k].r = zy[k].r * *(double *)((long)addr + (long)k * 8);
              zy[k].i = zy[k].i * *(double *)((long)addr + (long)k * 8);
            }
            zgstrs(trans,L,U,perm_c,perm_r,(SuperMatrix *)&Bstore,stat,info);
            if ((bVar8) && (bVar10)) {
              for (k = 0; k < A->ncol; k = k + 1) {
                zy[k].r = zy[k].r * C[k];
                zy[k].i = zy[k].i * C[k];
              }
            }
            else if ((!bVar8) && (bVar9)) {
              for (k = 0; k < A->ncol; k = k + 1) {
                zy[k].r = zy[k].r * R[k];
                zy[k].i = zy[k].i * R[k];
              }
            }
          }
        } while (safe1._4_4_ != 0);
        eps = 0.0;
        if ((bVar8) && (bVar10)) {
          for (k = 0; k < A->nrow; k = k + 1) {
            dVar12 = C[k];
            dVar13 = z_abs1(pdStack_c8 + k);
            if (eps <= dVar12 * dVar13) {
              local_3c0 = C[k];
              dVar12 = z_abs1(pdStack_c8 + k);
              local_3c0 = local_3c0 * dVar12;
            }
            else {
              local_3c0 = eps;
            }
            eps = local_3c0;
          }
        }
        else if ((bVar8) || (!bVar9)) {
          for (k = 0; k < A->nrow; k = k + 1) {
            dVar12 = z_abs1(pdStack_c8 + k);
            if (eps <= dVar12) {
              local_3f8 = z_abs1(pdStack_c8 + k);
            }
            else {
              local_3f8 = eps;
            }
            eps = local_3f8;
          }
        }
        else {
          for (k = 0; k < A->nrow; k = k + 1) {
            dVar12 = R[k];
            dVar13 = z_abs1(pdStack_c8 + k);
            if (eps <= dVar12 * dVar13) {
              local_3e0 = R[k];
              dVar12 = z_abs1(pdStack_c8 + k);
              local_3e0 = local_3e0 * dVar12;
            }
            else {
              local_3e0 = eps;
            }
            eps = local_3e0;
          }
        }
        if ((eps != 0.0) || (NAN(eps))) {
          ferr[irow] = ferr[irow] / eps;
        }
      }
      superlu_free(zy);
      superlu_free(addr);
      superlu_free(addr_00);
      superlu_free((void *)Bjcol._16_8_);
    }
  }
  else {
    k = -*info;
    input_error("zgsrfs",&k);
  }
  return;
}

Assistant:

void
zgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, double *R, double *C,
       SuperMatrix *B, SuperMatrix *X, double *ferr, double *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    doublecomplex ndone = {-1., 0.};
    doublecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    doublecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    double   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    double   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    doublecomplex   *work;
    double   *rwork;
    int      *iwork;
    int      isave[3];

    extern int zlacon2_(int *, doublecomplex *, doublecomplex *, double *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_Z || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("zgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = doublecomplexMalloc(2*A->nrow);
    rwork = (double *) SUPERLU_MALLOC( A->nrow * sizeof(double) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = dmach("Epsilon");
    safmin = dmach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    zcopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_zgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = z_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += z_abs1(&Aval[i]) * z_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, z_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (z_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		zaxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use ZLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = z_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = z_abs1( &Xptr[irow] );
		    s += z_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = z_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = z_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    zlacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);
                    }

		zgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
		}
		
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * z_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * z_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, z_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}